

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O3

string * MyCompiler::visitExpression
                   (string *__return_storage_ptr__,Expression *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  element_type *peVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  size_type *psVar6;
  long lVar7;
  long *plVar8;
  pointer ppVar9;
  string aTerm;
  string secondTerm;
  pointer local_110;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  char local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  _Alloc_hider local_58 [2];
  long local_48 [2];
  size_type *local_38;
  
  visitTerm(&local_f8,
            (ast->pTerm).super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            result,usedIdents,tempIdentCounter);
  peVar1 = (ast->pAddSubOp).super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (iVar4 = std::__cxx11::string::compare((char *)&(peVar1->super_AbstractAstNode).value),
     iVar4 != 0)) {
    ppVar9 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_110 = (ast->vAddSubOpExpression).
                super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (ppVar9 == local_110) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      goto LAB_0010a8c0;
    }
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar3 = false;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    nextTempIdent((string *)local_b8,usedIdents,tempIdentCounter);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b8);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"*","");
    local_98._M_p = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-1","");
    local_78._M_p = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    plVar8 = local_48;
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_58[0]._M_p = (pointer)plVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::
    vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
    ::emplace_back<std::array<std::__cxx11::string,4ul>>
              ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                *)result,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                *)local_b8);
    lVar7 = -0x80;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    ppVar9 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_110 = (ast->vAddSubOpExpression).
                super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = true;
  }
  if (ppVar9 != local_110) {
    local_38 = &__return_storage_ptr__->_M_string_length;
    do {
      visitTerm(&local_d8,&ppVar9->second,result,usedIdents,tempIdentCounter);
      if (!bVar3) {
        nextTempIdent((string *)local_b8,usedIdents,tempIdentCounter);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b8);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      local_b8._0_8_ = local_b8 + 0x10;
      pcVar2 = (ppVar9->first).super_AbstractAstNode.value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,pcVar2,
                 pcVar2 + (ppVar9->first).super_AbstractAstNode.value._M_string_length);
      local_98._M_p = local_88;
      psVar5 = &local_f8;
      if (bVar3) {
        psVar5 = __return_storage_ptr__;
      }
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      psVar6 = &local_f8._M_string_length;
      if (bVar3) {
        psVar6 = local_38;
      }
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar2,pcVar2 + *psVar6);
      local_78._M_p = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_58[0]._M_p = (pointer)local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
      std::
      vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
      ::emplace_back<std::array<std::__cxx11::string,4ul>>
                ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                  *)result,
                 (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)local_b8);
      lVar7 = -0x80;
      plVar8 = local_48;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -4;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      ppVar9 = ppVar9 + 1;
      bVar3 = true;
    } while (ppVar9 != local_110);
  }
LAB_0010a8c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitExpression(MyCompiler::Expression &ast,
                                        std::vector<std::array<std::string, 4>> &result,
                                        std::unordered_set<std::string> &usedIdents,
                                        int &tempIdentCounter)
{
    std::string aTerm = visitTerm(*ast.pTerm, result, usedIdents, tempIdentCounter);

    bool negative = ast.pAddSubOp != nullptr && ast.pAddSubOp->value == "-";
    if (!negative && ast.vAddSubOpExpression.empty())
        return aTerm;

    bool moreTerm = false;
    std::string temp;

    if (negative)
    {
        temp = nextTempIdent(usedIdents, tempIdentCounter);
        moreTerm = true;
        result.push_back({"*", "-1", aTerm, temp});
    }

    for (auto &item : ast.vAddSubOpExpression)
    {
        std::string secondTerm = visitTerm(item.second, result, usedIdents, tempIdentCounter);
        if (!moreTerm)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreTerm ? temp : aTerm,
                          secondTerm,
                          temp});
        moreTerm = true;
    }

    return temp;
}